

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryAnimationClipsLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryAnimationClipsLoader,COLLADASaxFWL::LibraryAnimationClipsLoader15>
          (RootParser15 *this,char *id)

{
  LibraryAnimationClipsLoader *this_00;
  IParserImpl *parserImpl;
  long in_RDI;
  LibraryAnimationClipsLoader15 *loader15;
  LibraryAnimationClipsLoader *loader;
  LibraryAnimationClipsLoader *in_stack_ffffffffffffff98;
  LibraryAnimationClipsLoader15 *in_stack_ffffffffffffffa0;
  IFilePartLoader *in_stack_ffffffffffffffa8;
  LibraryAnimationClipsLoader *in_stack_ffffffffffffffb0;
  IParserImpl *pIVar1;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryAnimationClipsLoader *)operator_new(0x58);
  LibraryAnimationClipsLoader::LibraryAnimationClipsLoader
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryAnimationClipsLoader15::LibraryAnimationClipsLoader15
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader(*(IFilePartLoader **)(in_RDI + 0x20),(IFilePartLoader *)this_00);
  pIVar1 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    pIVar1 = parserImpl + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x50))(*(long **)(in_RDI + 0x20),pIVar1);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}